

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O3

Cut_Cut_t *
Cut_OracleComputeCuts(Cut_Oracle_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Cut_Cut_t *pCVar3;
  Cut_Cut_t *pCut1;
  int iVar4;
  uint uVar5;
  void **ppvVar6;
  Cut_Cut_t *pCut;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  Cut_Cut_t **ppCVar10;
  Cut_Cut_t *pCVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint *puVar15;
  uint *puVar16;
  timespec ts;
  timespec local_68;
  ulong local_58;
  Cut_Cut_t *local_50;
  long local_48;
  ulong local_40;
  Cut_Cut_t **local_38;
  
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (-1 < Node0) {
    uVar5 = p->vCutsNew->nSize;
    if (((Node0 < (int)uVar5) && (-1 < Node1)) && ((uint)Node1 < uVar5)) {
      ppvVar6 = p->vCutsNew->pArray;
      puVar16 = (uint *)ppvVar6[(uint)Node0];
      local_48 = lVar9;
      if ((puVar16 == (uint *)0x0) ||
         (puVar15 = (uint *)ppvVar6[(uint)Node1], puVar15 == (uint *)0x0)) {
        __assert_fail("pList0 && pList1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                      ,0x14a,
                      "Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)");
      }
      p->fSimul = (*puVar15 >> 0x16 & 1 ^ fCompl1) & (*puVar16 >> 0x16 & 1 ^ fCompl0);
      p->vCuts0->nSize = 0;
      do {
        pVVar2 = p->vCuts0;
        uVar5 = pVVar2->nSize;
        if (uVar5 == pVVar2->nCap) {
          if ((int)uVar5 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar6;
            pVVar2->nCap = 0x10;
          }
          else {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar5 << 4);
            }
            pVVar2->pArray = ppvVar6;
            pVVar2->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = pVVar2->pArray;
        }
        iVar4 = pVVar2->nSize;
        pVVar2->nSize = iVar4 + 1;
        ppvVar6[iVar4] = puVar16;
        puVar16 = *(uint **)(puVar16 + 4);
      } while (puVar16 != (uint *)0x0);
      p->vCuts1->nSize = 0;
      do {
        pVVar2 = p->vCuts1;
        uVar5 = pVVar2->nSize;
        if (uVar5 == pVVar2->nCap) {
          if ((int)uVar5 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar6;
            pVVar2->nCap = 0x10;
          }
          else {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar5 << 4);
            }
            pVVar2->pArray = ppvVar6;
            pVVar2->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = pVVar2->pArray;
        }
        iVar4 = pVVar2->nSize;
        pVVar2->nSize = iVar4 + 1;
        ppvVar6[iVar4] = puVar15;
        puVar15 = *(uint **)(puVar15 + 4);
      } while (puVar15 != (uint *)0x0);
      if (((-1 < Node) && (Node < p->vNodeCuts->nSize)) && (Node < p->vNodeStarts->nSize)) {
        uVar14 = (ulong)(uint)Node;
        iVar4 = p->vNodeStarts->pArray[uVar14];
        lVar9 = (long)iVar4;
        if ((-1 < lVar9) && (iVar4 < p->vCutPairs->nSize)) {
          if (p->vCutPairs->pArray[lVar9] != 0) {
            __assert_fail("Vec_IntEntry(p->vCutPairs, iCutStart) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                          ,0x15c,
                          "Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                         );
          }
          uVar5 = p->vNodeCuts->pArray[uVar14];
          local_58 = uVar14;
          local_50 = Cut_CutTriv(p,Node);
          ppCVar10 = &local_50->pNext;
          local_40 = (ulong)uVar5;
          if (1 < (int)uVar5) {
            uVar14 = 1;
            do {
              if (p->vCutPairs->nSize <= (int)(uVar14 + lVar9)) goto LAB_004b8480;
              uVar5 = p->vCutPairs->pArray[uVar14 + lVar9];
              uVar8 = uVar5 & 0xffff;
              if (((p->vCuts0->nSize <= (int)uVar8) ||
                  (uVar5 = (int)uVar5 >> 0x10, local_38 = ppCVar10, (int)uVar5 < 0)) ||
                 (p->vCuts1->nSize <= (int)uVar5)) goto LAB_004b8442;
              pCVar3 = (Cut_Cut_t *)p->vCuts0->pArray[uVar8];
              pCut1 = (Cut_Cut_t *)p->vCuts1->pArray[uVar5];
              pCut = Cut_CutStart(p);
              iVar4 = p->pParams->nVarsMax;
              if ((long)iVar4 < 1) {
                uVar8 = 0;
                uVar5 = 0;
                uVar7 = 0;
              }
              else {
                pCVar11 = pCut + 1;
                uVar7 = 0;
                uVar5 = 0;
                uVar8 = 0;
                do {
                  if (uVar5 == *(uint *)pCut1 >> 0x1c) {
                    if (uVar8 == *(uint *)pCVar3 >> 0x1c) goto LAB_004b834f;
                    lVar13 = (long)(int)uVar8;
                    uVar8 = uVar8 + 1;
                    iVar12 = *(int *)(&pCVar3[1].field_0x0 + lVar13 * 4);
LAB_004b82ff:
                    *(int *)pCVar11 = iVar12;
                  }
                  else {
                    lVar13 = (long)(int)uVar5;
                    if (uVar8 == *(uint *)pCVar3 >> 0x1c) {
                      uVar5 = uVar5 + 1;
                      iVar12 = *(int *)(&pCut1[1].field_0x0 + lVar13 * 4);
                      goto LAB_004b82ff;
                    }
                    iVar12 = *(int *)(&pCVar3[1].field_0x0 + (long)(int)uVar8 * 4);
                    iVar1 = *(int *)(&pCut1[1].field_0x0 + lVar13 * 4);
                    if (iVar12 < iVar1) {
                      uVar8 = uVar8 + 1;
                      goto LAB_004b82ff;
                    }
                    if (iVar1 < iVar12) {
                      uVar5 = uVar5 + 1;
                      *(int *)pCVar11 = iVar1;
                    }
                    else {
                      uVar8 = uVar8 + 1;
                      *(int *)pCVar11 = iVar12;
                      uVar5 = uVar5 + 1;
                    }
                  }
                  uVar7 = uVar7 + 0x10000000;
                  pCVar11 = (Cut_Cut_t *)&pCVar11->uSign;
                } while ((long)iVar4 << 0x1c != uVar7);
                uVar7 = (ulong)(uint)(iVar4 << 0x1c);
              }
              if ((uVar8 != *(uint *)pCVar3 >> 0x1c) || (uVar5 != *(uint *)pCut1 >> 0x1c)) {
                __assert_fail("i == (int)pCut0->nLeaves && k == (int)pCut1->nLeaves",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                              ,0x130,
                              "Cut_Cut_t *Cut_CutMerge(Cut_Oracle_t *, Cut_Cut_t *, Cut_Cut_t *)");
              }
LAB_004b834f:
              *(uint *)pCut = *(uint *)pCut & 0xfffffff | (uint)uVar7;
              *local_38 = pCut;
              if (p->pParams->fTruth != 0) {
                Cut_TruthComputeOld(pCut,pCVar3,pCut1,fCompl0,fCompl1);
              }
              uVar14 = uVar14 + 1;
              ppCVar10 = &pCut->pNext;
            } while (uVar14 != local_40);
          }
          lVar9 = local_48;
          pCVar3 = local_50;
          *ppCVar10 = (Cut_Cut_t *)0x0;
          if (Node < p->vCutsNew->nSize) {
            ppvVar6 = p->vCutsNew->pArray;
            if (ppvVar6[local_58] != (void *)0x0) {
              __assert_fail("Vec_PtrEntry( p->vCutsNew, Node ) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                            ,0x170,
                            "Cut_Cut_t *Cut_OracleComputeCuts(Cut_Oracle_t *, int, int, int, int, int)"
                           );
            }
            ppvVar6[local_58] = local_50;
            iVar4 = clock_gettime(3,&local_68);
            if (iVar4 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
            }
            p->timeTotal = p->timeTotal + lVar13 + lVar9;
            return pCVar3;
          }
          goto LAB_004b8442;
        }
      }
LAB_004b8480:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
LAB_004b8442:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Cut_Cut_t * Cut_OracleComputeCuts( Cut_Oracle_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut, * pCut0, * pCut1, * pList0, * pList1;
    int iCutStart, nCuts, i, Entry;
    abctime clk = Abc_Clock();

    // get the cuts of the children
    pList0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node0 );
    pList1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node1 );
    assert( pList0 && pList1 );

    // get the complemented attribute of the cut
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);

    // collect the cuts
    Vec_PtrClear( p->vCuts0 );
    Cut_ListForEachCut( pList0, pCut )
        Vec_PtrPush( p->vCuts0, pCut );
    Vec_PtrClear( p->vCuts1 );
    Cut_ListForEachCut( pList1, pCut )
        Vec_PtrPush( p->vCuts1, pCut );

    // get the first and last cuts of this node
    nCuts = Vec_IntEntry(p->vNodeCuts, Node);
    iCutStart = Vec_IntEntry(p->vNodeStarts, Node);

    // create trivial cut
    assert( Vec_IntEntry(p->vCutPairs, iCutStart) == 0 );
    pCut = Cut_CutTriv( p, Node );
    *ppTail = pCut;
    ppTail = &pCut->pNext;
    // create other cuts
    for ( i = 1; i < nCuts; i++ )
    {
        Entry = Vec_IntEntry( p->vCutPairs, iCutStart + i );
        pCut0 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts0, Entry & 0xFFFF );
        pCut1 = (Cut_Cut_t *)Vec_PtrEntry( p->vCuts1, Entry >> 16 );
        pCut  = Cut_CutMerge( p, pCut0, pCut1 );
        *ppTail = pCut;
        ppTail = &pCut->pNext;
        // compute the truth table
        if ( p->pParams->fTruth )
            Cut_TruthComputeOld( pCut, pCut0, pCut1, fCompl0, fCompl1 );
    }
    *ppTail = NULL;

    // write the new cut
    assert( Vec_PtrEntry( p->vCutsNew, Node ) == NULL );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
p->timeTotal += Abc_Clock() - clk;
    return pList;
}